

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cc
# Opt level: O1

void __thiscall ReportAsync::~ReportAsync(ReportAsync *this)

{
  thread *ptVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  (this->super_Reporter).super_ThreadCapture<Reporter>._vptr_ThreadCapture =
       (_func_int **)&PTR__ReportAsync_00107cb8;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_lock_);
  if (iVar2 == 0) {
    this->terminated_ = true;
    std::condition_variable::notify_all();
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_lock_);
    if ((this->reporter_thread_)._M_t.
        super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
        super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
        super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Waiting for reporter thread to finish...",0x28);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      std::thread::join();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Reporter thread finished.",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
    }
    (this->cross_and_capture_to_).super_ThreadCrosser._vptr_ThreadCrosser =
         (_func_int **)&PTR__AutoThreadCrosser_00107d20;
    *(Reporter **)(in_FS_OFFSET + -0x10) = (this->cross_and_capture_to_).capture_to_.previous_;
    capture_thread::ThreadCrosser::SetCurrent((this->cross_and_capture_to_).cross_with_.parent_);
    ptVar1 = (this->reporter_thread_)._M_t.
             super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
             super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
             super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
    if (ptVar1 != (thread *)0x0) {
      if ((ptVar1->_M_id)._M_thread != 0) goto LAB_001038ee;
      operator_delete(ptVar1);
    }
    (this->reporter_thread_)._M_t.
    super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
    super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
    super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
    std::
    deque<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~deque(&(this->queue_).c);
    std::condition_variable::~condition_variable(&this->queue_wait_);
    return;
  }
  std::__throw_system_error(iVar2);
LAB_001038ee:
  std::terminate();
}

Assistant:

~ReportAsync() {
    {
      std::lock_guard<std::mutex> lock(queue_lock_);
      terminated_ = true;
      queue_wait_.notify_all();
    }
    if (reporter_thread_) {
      std::cerr << "Waiting for reporter thread to finish..." << std::endl;
      reporter_thread_->join();
      std::cerr << "Reporter thread finished." << std::endl;
    }
  }